

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O3

void __thiscall TPZCondensedCompEl::LoadSolution(TPZCondensedCompEl *this)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  TNode *pTVar4;
  TPZCompMesh *pTVar5;
  TPZCompMesh *pTVar6;
  TPZFMatrix<double> *this_00;
  TPZConnect *pTVar7;
  int64_t iVar8;
  double *pdVar9;
  int iVar10;
  int64_t size;
  ulong uVar11;
  long lVar12;
  int64_t size_1;
  ulong uVar13;
  long lVar14;
  TPZFMatrix<double> u1;
  uint local_378;
  pair<long,_long> local_348;
  TPZFMatrix<double> local_338;
  TPZFMatrix<double> local_2a8;
  double local_218 [61];
  
  TPZCompEl::LoadSolution(&this->super_TPZCompEl);
  if ((this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
      (this->fCondensed).fDim1) {
    iVar8 = (this->fCondensedConnectIndexes).super_TPZVec<long>.fNElements;
    iVar3 = (int)(this->fActiveConnectIndexes).super_TPZVec<long>.fNElements;
    lVar12 = this->fNumTotalEqs;
    lVar14 = lVar12 - this->fNumInternalEqs;
    pTVar5 = TPZCompEl::Mesh(&this->super_TPZCompEl);
    pTVar6 = TPZCompEl::Mesh(&this->super_TPZCompEl);
    this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar6->fSolution);
    uVar13 = lVar14 << 0x20;
    uVar11 = (ulong)(int)lVar14;
    local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_338.fElem = (double *)0x0;
    local_338.fGiven = (double *)0x0;
    local_338.fSize = 0;
    local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar11;
    TPZVec<int>::TPZVec(&local_338.fPivot.super_TPZVec<int>,0);
    local_338.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_338.fPivot.super_TPZVec<int>.fStore = local_338.fPivot.fExtAlloc;
    local_338.fPivot.super_TPZVec<int>.fNElements = 0;
    local_338.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_338.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_338.fWork.fStore = (double *)0x0;
    local_338.fWork.fNElements = 0;
    local_338.fWork.fNAlloc = 0;
    if ((uVar13 != 0) &&
       (local_338.fElem =
             (double *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | (long)uVar13 >> 0x1d),
       0 < (long)uVar11)) {
      memset(local_338.fElem,0,uVar13 >> 0x1d);
    }
    local_2a8.fElem = local_218;
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018175b8;
    local_2a8.fSize = 0x3c;
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)lVar12;
    local_2a8.fGiven = local_2a8.fElem;
    TPZVec<int>::TPZVec(&local_2a8.fPivot.super_TPZVec<int>,0);
    local_2a8.fPivot.super_TPZVec<int>.fStore = local_2a8.fPivot.fExtAlloc;
    local_2a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_2a8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_2a8.fWork.fStore = (double *)0x0;
    local_2a8.fWork.fNElements = 0;
    local_2a8.fWork.fNAlloc = 0;
    if (lVar12 << 0x20 == 0) {
      local_2a8.fElem = (double *)0x0;
    }
    else if (0x3c < (long)(int)lVar12) {
      local_2a8.fElem = (double *)operator_new__((ulong)(lVar12 << 0x20) >> 0x1d);
    }
    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018172c8;
    TPZFMatrix<double>::operator=(&local_2a8,0.0);
    if (0 < iVar3) {
      lVar12 = 0;
      iVar10 = 0;
      do {
        lVar14 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))(this,iVar10);
        pTVar4 = (pTVar5->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        uVar2 = pTVar4[*(int *)(lVar14 + 8)].dim;
        uVar11 = (ulong)uVar2;
        if ((uVar11 != 0) && (0 < (int)uVar2)) {
          lVar14 = (long)pTVar4[*(int *)(lVar14 + 8)].pos;
          do {
            if (((lVar14 < 0) ||
                ((this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14)) ||
               ((this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((lVar12 < 0) ||
                (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12)) ||
               (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_338.fElem[lVar12] = this_00->fElem[lVar14];
            lVar12 = lVar12 + 1;
            lVar14 = lVar14 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar3);
    }
    TPZMatRed<double,_TPZFMatrix<double>_>::UGlobal(&this->fCondensed,&local_338,&local_2a8);
    local_378 = (uint)iVar8;
    if (0 < (int)local_378) {
      uVar11 = 0;
      lVar12 = 0;
      do {
        iVar8 = (this->fCondensedConnectIndexes).super_TPZVec<long>.fStore[uVar11];
        pTVar6 = TPZCompEl::Mesh(&this->super_TPZCompEl);
        pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(pTVar6->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,iVar8);
        lVar14 = (long)(int)pTVar7->fSequenceNumber;
        iVar3 = (pTVar5->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar14].dim;
        if (0 < iVar3) {
          iVar10 = 0;
          do {
            if (((lVar12 < 0) ||
                (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12)) ||
               (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar1 = local_2a8.fElem[lVar12];
            iVar8 = TPZBlock::Index(&pTVar5->fBlock,lVar14,iVar10);
            local_348.second = TPZBlock::Index(&pTVar5->fBlock,0,0);
            local_348.first = iVar8;
            pdVar9 = TPZMatrix<double>::at(&this_00->super_TPZMatrix<double>,&local_348);
            *pdVar9 = dVar1;
            iVar10 = iVar10 + 1;
            lVar12 = lVar12 + 1;
          } while (iVar3 != iVar10);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (local_378 & 0x7fffffff));
    }
    (**(code **)(*(long *)this->fReferenceCompEl + 0xc0))();
    TPZFMatrix<double>::~TPZFMatrix(&local_2a8,&PTR_PTR_01817580);
    TPZFMatrix<double>::~TPZFMatrix(&local_338);
  }
  return;
}

Assistant:

void TPZCondensedCompEl::LoadSolution()
{
//    if (fKeepMatrix == false) {
//        fKeepMatrix = true;
//        fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
//        fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);
//        TPZElementMatrix ek,ef;
//        CalcStiff(ek, ef);
//        fKeepMatrix = false;
//    }
    // initialize the solution of the constrained connects
    TPZCompEl::LoadSolution();
    
    // if the matrix has not been condensed then nothing to do
    if (fCondensed.Rows() != fCondensed.Dim1())
    {
        return;
    }
    // compute the solution of the internal equations
    int dim0=0, dim1=0;
    int nc = fIndexes.size(),nc0 = fCondensedConnectIndexes.size(), nc1 = fActiveConnectIndexes.size();
//    int ic;
//    for (ic=0; ic<nc ; ic++) {
//        int64_t connectindex = fIndexes[ic];
//        TPZConnect &con = fReferenceCompEl->Connect(connectindex);
//        int sz = con.NShape()*con.NState();
//        if (con.IsCondensed()) {
//#ifdef PZDEBUG
//            if (dim1) {
//                DebugStop();
//            }
//#endif
//            dim0 += sz;
//        }
//        else
//        {
//            dim1 += sz;
//        }
//    }
    dim0 = fNumInternalEqs;
    dim1 = fNumTotalEqs-dim0;
    //TPZBlock &bl = Mesh()->Block();
	TPZBlock &bl = Mesh()->Block();
    TPZFMatrix<STATE> &sol = Mesh()->Solution();
    int64_t count = 0;
    //TPZFMatrix<REAL> u1(dim1,1,0.);
	TPZFMatrix<STATE> u1(dim1,1,0.);
    //TPZFMatrix<REAL> elsol(dim0+dim1,1,0.);
	TPZFNMatrix<60,STATE> elsol(dim0+dim1,1,0.);
    for (int ic=0; ic<nc1 ; ic++) {
        TPZConnect &c = Connect(ic);
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        if(blsize)
        {
            int64_t firsteq = bl.Position(seqnum);
            for (int ibl=0; ibl<blsize; ibl++) {
                u1(count++,0) = sol(firsteq+ibl,0);
            }
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        TPZManVector<int64_t,60> u1eq(dim1);
        int64_t count = 0;
        for (int ic=0; ic<nc1 ; ic++) {
            TPZConnect &c = Connect(ic);
            int64_t seqnum = c.SequenceNumber();
            int blsize = bl.Size(seqnum);
            if(blsize)
            {
                int64_t firsteq = bl.Position(seqnum);
                for (int ibl=0; ibl<blsize; ibl++) {
                    u1eq[count++] = firsteq+ibl;
                }
            }
        }
        std::stringstream sout;
        sout << "Computing UGlobal Index " << Index();
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = u1(i,0);
        sout << "u1 " << u1vec << std::endl;
        sout << "u1 eq " << u1eq << std::endl;
        for(int i=0; i<dim1; i++) sout << sol(u1eq[i],0) << ' ';
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCondensed.UGlobal(u1, elsol);
    count = 0;
    for (int ic=0; ic<nc0 ; ic++) {
        int64_t cindex = fCondensedConnectIndexes[ic];
        TPZConnect &c = Mesh()->ConnectVec()[cindex];
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        for (int ibl=0; ibl<blsize; ibl++) {
            sol.at(bl.at(seqnum,0,ibl,0)) = elsol(count++,0);
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "After Computing UGlobal Index " << Index() ;
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1+dim0);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = elsol(i,0);
        sout << "elsol " << u1vec;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fReferenceCompEl->LoadSolution();
//    if (fKeepMatrix == false) {
//        fCondensed.Redim(0,0);
//        fCondensed.K00()->Redim(0, 0);
//    }

}